

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::JsonStreamParser::JsonStreamParser
          (JsonStreamParser *this,ObjectWriter *ow)

{
  ParseType local_44 [4];
  allocator local_31;
  
  this->_vptr_JsonStreamParser = (_func_int **)&PTR__JsonStreamParser_003e3da0;
  this->ow_ = ow;
  std::
  stack<google::protobuf::util::converter::JsonStreamParser::ParseType,std::deque<google::protobuf::util::converter::JsonStreamParser::ParseType,std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>>>
  ::
  stack<std::deque<google::protobuf::util::converter::JsonStreamParser::ParseType,std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>>,void>
            (&this->stack_);
  (this->leftover_)._M_dataplus._M_p = (pointer)&(this->leftover_).field_2;
  (this->leftover_)._M_string_length = 0;
  (this->leftover_).field_2._M_local_buf[0] = '\0';
  (this->json_).ptr_ = (char *)0x0;
  (this->json_).length_ = 0;
  (this->p_).ptr_ = (char *)0x0;
  (this->p_).length_ = 0;
  (this->key_).ptr_ = (char *)0x0;
  (this->key_).length_ = 0;
  (this->key_storage_)._M_dataplus._M_p = (pointer)&(this->key_storage_).field_2;
  (this->key_storage_)._M_string_length = 0;
  (this->key_storage_).field_2._M_local_buf[0] = '\0';
  this->finishing_ = false;
  (this->parsed_).ptr_ = (char *)0x0;
  (this->parsed_).length_ = 0;
  (this->parsed_storage_)._M_dataplus._M_p = (pointer)&(this->parsed_storage_).field_2;
  (this->parsed_storage_)._M_string_length = 0;
  (this->parsed_storage_).field_2._M_local_buf[0] = '\0';
  this->string_open_ = '\0';
  (this->chunk_storage_)._M_dataplus._M_p = (pointer)&(this->chunk_storage_).field_2;
  (this->chunk_storage_)._M_string_length = 0;
  (this->chunk_storage_).field_2._M_local_buf[0] = '\0';
  this->coerce_to_utf8_ = false;
  std::__cxx11::string::string((string *)&this->utf8_replacement_character_," ",&local_31);
  this->allow_empty_null_ = false;
  this->allow_permissive_key_naming_ = false;
  this->loose_float_number_conversion_ = false;
  this->recursion_depth_ = 0;
  this->max_recursion_depth_ = 100;
  local_44[0] = VALUE;
  std::
  deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ::emplace_back<google::protobuf::util::converter::JsonStreamParser::ParseType>
            (&(this->stack_).c,local_44);
  return;
}

Assistant:

JsonStreamParser::JsonStreamParser(ObjectWriter* ow)
    : ow_(ow),
      stack_(),
      leftover_(),
      json_(),
      p_(),
      key_(),
      key_storage_(),
      finishing_(false),
      parsed_(),
      parsed_storage_(),
      string_open_(0),
      chunk_storage_(),
      coerce_to_utf8_(false),
      utf8_replacement_character_(" "),
      allow_empty_null_(false),
      allow_permissive_key_naming_(false),
      loose_float_number_conversion_(false),
      recursion_depth_(0),
      max_recursion_depth_(kDefaultMaxRecursionDepth) {
  // Initialize the stack with a single value to be parsed.
  stack_.push(VALUE);
}